

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_io.cc
# Opt level: O1

void core::image::save_ppm_16_file(ConstPtr *image,string *filename)

{
  ConstPtr local_20;
  
  local_20.super___shared_ptr<const_core::ImageBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (image->super___shared_ptr<const_core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr;
  local_20.super___shared_ptr<const_core::ImageBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (image->super___shared_ptr<const_core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi;
  if (local_20.super___shared_ptr<const_core::ImageBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_20.super___shared_ptr<const_core::ImageBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_20.super___shared_ptr<const_core::ImageBase,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_20.super___shared_ptr<const_core::ImageBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_20.super___shared_ptr<const_core::ImageBase,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  save_ppm_file_intern(&local_20,filename);
  if (local_20.super___shared_ptr<const_core::ImageBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<const_core::ImageBase,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    return;
  }
  return;
}

Assistant:

void
save_ppm_16_file (RawImage::ConstPtr image, std::string const& filename)
{
    save_ppm_file_intern(image, filename);
}